

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_dec_clnpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,OPJ_UINT32 ci
               ,OPJ_UINT32 vsc)

{
  OPJ_UINT32 *pOVar1;
  byte *pbVar2;
  opj_mqc_state_t *poVar3;
  OPJ_BYTE *pOVar4;
  OPJ_INT32 OVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  uint uVar12;
  OPJ_UINT32 OVar13;
  uint uVar14;
  uint uVar15;
  opj_mqc_state_t **ppoVar16;
  
  bVar7 = (byte)(ci * 3);
  if ((*flagsp >> (bVar7 & 0x1f) & 0x200010) == 0) {
    ppoVar16 = (t1->mqc).ctxs + (t1->mqc).lut_ctxno_zc_orient[*flagsp >> (bVar7 & 0x1f) & 0x1ef];
    (t1->mqc).curctx = ppoVar16;
    poVar3 = *ppoVar16;
    uVar12 = poVar3->qeval;
    uVar14 = (t1->mqc).c;
    uVar10 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar10;
    if (uVar14 >> 0x10 < uVar12) {
      uVar15 = (uint)(poVar3->mps == 0);
      if (uVar12 > uVar10) {
        uVar15 = poVar3->mps;
      }
      (t1->mqc).a = uVar12;
      *ppoVar16 = (&poVar3->nmps)[uVar12 <= uVar10];
      OVar11 = (t1->mqc).ct;
      do {
        if (OVar11 == 0) {
          pOVar4 = (t1->mqc).bp;
          bVar8 = pOVar4[1];
          if (*pOVar4 == 0xff) {
            if (bVar8 < 0x90) {
              (t1->mqc).bp = pOVar4 + 1;
              uVar14 = uVar14 + (uint)bVar8 * 0x200;
              OVar11 = 7;
              goto LAB_00134004;
            }
            uVar14 = uVar14 + 0xff00;
            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar1 = *pOVar1 + 1;
          }
          else {
            (t1->mqc).bp = pOVar4 + 1;
            uVar14 = uVar14 + (uint)bVar8 * 0x100;
          }
          OVar11 = 8;
        }
LAB_00134004:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar14 = uVar14 * 2;
        (t1->mqc).c = uVar14;
        OVar11 = OVar11 - 1;
        (t1->mqc).ct = OVar11;
      } while (uVar12 < 0x8000);
    }
    else {
      uVar14 = uVar14 + uVar12 * -0x10000;
      (t1->mqc).c = uVar14;
      if ((short)uVar10 < 0) {
        uVar15 = poVar3->mps;
        uVar12 = uVar10;
      }
      else {
        uVar15 = (uint)(poVar3->mps == 0);
        if (uVar10 >= uVar12) {
          uVar15 = poVar3->mps;
        }
        *ppoVar16 = (&poVar3->nmps)[uVar10 < uVar12];
        OVar11 = (t1->mqc).ct;
        uVar12 = uVar10;
        do {
          if (OVar11 == 0) {
            pOVar4 = (t1->mqc).bp;
            bVar8 = pOVar4[1];
            if (*pOVar4 == 0xff) {
              if (bVar8 < 0x90) {
                (t1->mqc).bp = pOVar4 + 1;
                uVar14 = uVar14 + (uint)bVar8 * 0x200;
                OVar11 = 7;
                goto LAB_001340a4;
              }
              uVar14 = uVar14 + 0xff00;
              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar1 = *pOVar1 + 1;
            }
            else {
              (t1->mqc).bp = pOVar4 + 1;
              uVar14 = uVar14 + (uint)bVar8 * 0x100;
            }
            OVar11 = 8;
          }
LAB_001340a4:
          uVar12 = uVar12 * 2;
          (t1->mqc).a = uVar12;
          uVar14 = uVar14 * 2;
          (t1->mqc).c = uVar14;
          OVar11 = OVar11 - 1;
          (t1->mqc).ct = OVar11;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar15 != 0) {
      uVar10 = *flagsp;
      bVar8 = 0xe;
      if (ci != 0) {
        bVar8 = bVar7 + 0xc;
      }
      uVar15 = uVar10 >> (bVar7 + 0x10 & 0x1f) & 0x40 | uVar10 >> (bVar7 & 0x1f) & 0xaa |
               uVar10 >> (bVar8 & 0x1f) & 0x10 |
               (uint)((flagsp[-1] >> (ci * 3 + 0x13 & 0x1f) & 1) != 0) |
               flagsp[1] >> (bVar7 + 0x11 & 0x1f) & 4;
      bVar8 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
              [uVar15];
      ppoVar16 = (t1->mqc).ctxs + bVar8;
      (t1->mqc).curctx = ppoVar16;
      poVar3 = (t1->mqc).ctxs[bVar8];
      uVar10 = poVar3->qeval;
      uVar12 = uVar12 - uVar10;
      (t1->mqc).a = uVar12;
      if (uVar14 >> 0x10 < uVar10) {
        uVar9 = (uint)(poVar3->mps == 0);
        if (uVar10 > uVar12) {
          uVar9 = poVar3->mps;
        }
        (t1->mqc).a = uVar10;
        *ppoVar16 = (&poVar3->nmps)[uVar10 <= uVar12];
        OVar11 = (t1->mqc).ct;
        do {
          if (OVar11 == 0) {
            pOVar4 = (t1->mqc).bp;
            bVar8 = pOVar4[1];
            if (*pOVar4 == 0xff) {
              if (bVar8 < 0x90) {
                (t1->mqc).bp = pOVar4 + 1;
                uVar14 = uVar14 + (uint)bVar8 * 0x200;
                OVar11 = 7;
                goto LAB_001341f3;
              }
              uVar14 = uVar14 + 0xff00;
              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar1 = *pOVar1 + 1;
            }
            else {
              (t1->mqc).bp = pOVar4 + 1;
              uVar14 = uVar14 + (uint)bVar8 * 0x100;
            }
            OVar11 = 8;
          }
LAB_001341f3:
          uVar10 = uVar10 * 2;
          (t1->mqc).a = uVar10;
          uVar14 = uVar14 * 2;
          (t1->mqc).c = uVar14;
          OVar11 = OVar11 - 1;
          (t1->mqc).ct = OVar11;
        } while (uVar10 < 0x8000);
      }
      else {
        OVar11 = uVar14 + uVar10 * -0x10000;
        (t1->mqc).c = OVar11;
        if ((short)uVar12 < 0) {
          uVar9 = poVar3->mps;
        }
        else {
          uVar9 = (uint)(poVar3->mps == 0);
          if (uVar12 >= uVar10) {
            uVar9 = poVar3->mps;
          }
          *ppoVar16 = (&poVar3->nmps)[uVar12 < uVar10];
          OVar13 = (t1->mqc).ct;
          do {
            if (OVar13 == 0) {
              pOVar4 = (t1->mqc).bp;
              bVar8 = pOVar4[1];
              if (*pOVar4 == 0xff) {
                if (bVar8 < 0x90) {
                  (t1->mqc).bp = pOVar4 + 1;
                  OVar11 = OVar11 + (uint)bVar8 * 0x200;
                  OVar13 = 7;
                  goto LAB_0013429c;
                }
                OVar11 = OVar11 + 0xff00;
                pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                *pOVar1 = *pOVar1 + 1;
              }
              else {
                (t1->mqc).bp = pOVar4 + 1;
                OVar11 = OVar11 + (uint)bVar8 * 0x100;
              }
              OVar13 = 8;
            }
LAB_0013429c:
            uVar12 = uVar12 * 2;
            (t1->mqc).a = uVar12;
            OVar11 = OVar11 * 2;
            (t1->mqc).c = OVar11;
            OVar13 = OVar13 - 1;
            (t1->mqc).ct = OVar13;
          } while (uVar12 < 0x8000);
        }
      }
      uVar12 = uVar9 ^ ""[uVar15];
      OVar5 = -oneplushalf;
      if (uVar9 == ""[uVar15]) {
        OVar5 = oneplushalf;
      }
      *datap = OVar5;
      flagsp[-1] = flagsp[-1] | 0x20 << (bVar7 & 0x1f);
      *flagsp = *flagsp | (uVar12 << 0x13 | 0x10) << (bVar7 & 0x1f);
      flagsp[1] = flagsp[1] | 8 << (bVar7 & 0x1f);
      if (vsc == 0 && ci == 0) {
        uVar14 = t1->w + 2;
        *(ulong *)(flagsp + (-1 - (ulong)uVar14)) =
             CONCAT44(uVar12 << 0x1f,0x20000) | 0x1000000000000 |
             *(ulong *)(flagsp + (-1 - (ulong)uVar14));
        pbVar2 = (byte *)((long)flagsp + (ulong)uVar14 * -4 + 5);
        *pbVar2 = *pbVar2 | 0x80;
      }
      if (ci == 3) {
        uVar6 = (ulong)(t1->w + 2);
        *(ulong *)(flagsp + (uVar6 - 1)) =
             CONCAT44(uVar12 << 0x12,4) | 0x200000000 | *(ulong *)(flagsp + (uVar6 - 1));
        *(byte *)(flagsp + uVar6 + 1) = (byte)flagsp[uVar6 + 1] | 1;
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_clnpass_step(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 ci,
    OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */
    opj_t1_dec_clnpass_step_macro(OPJ_TRUE, OPJ_FALSE,
                                  *flagsp, flagsp, t1->w + 2U, datap,
                                  0, ci, mqc, mqc->curctx,
                                  v, mqc->a, mqc->c, mqc->ct, oneplushalf, vsc);
}